

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBezierCurves(XMLLoader *this,Ref<embree::XML> *xml,CurveSubtype subtype)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  XML *pXVar3;
  pointer puVar4;
  HairSetNode *pHVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  HairSetNode *pHVar10;
  int in_ECX;
  undefined8 *siglen;
  undefined4 in_register_00000014;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *sig;
  ulong uVar11;
  XMLLoader *ctx;
  uchar *in_R8;
  size_t in_R9;
  string tessellation_rate;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> indices;
  Ref<embree::SceneGraph::MaterialNode> material;
  string local_e8;
  string local_c8;
  undefined8 *local_a8;
  XMLLoader *local_a0;
  _Alloc_hider local_98;
  HairSetNode *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  pointer local_78 [2];
  undefined1 local_68 [32];
  Ref<embree::SceneGraph::MaterialNode> local_48;
  _Alloc_hider local_40;
  _Alloc_hider local_38;
  
  local_a8 = (undefined8 *)CONCAT44(in_register_00000014,subtype);
  psVar2 = (string *)*local_a8;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_a0 = (XMLLoader *)xml;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"material","");
  XML::child((XML *)&local_c8,psVar2);
  loadMaterial((XMLLoader *)&stack0xffffffffffffffc0,(Ref<embree::XML> *)local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 0x18))();
  }
  local_38._M_p = (pointer)this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  pHVar10 = (HairSetNode *)operator_new(0x118);
  local_48.ptr = (MaterialNode *)local_40._M_p;
  local_98._M_p = local_40._M_p;
  local_90 = pHVar10;
  if ((MaterialNode *)local_40._M_p != (MaterialNode *)0x0) {
    (*(code *)((*(XML **)local_40._M_p)->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)(local_40._M_p);
  }
  pHVar5 = local_90;
  siglen = (undefined8 *)0x0;
  SceneGraph::HairSetNode::HairSetNode
            (local_90,RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE - (in_ECX == 0),&local_48,
             (BBox1f)0x3f80000000000000,0);
  (*(pHVar5->super_Node).super_RefCount._vptr_RefCount[2])(pHVar5);
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*(code *)(((XML *)((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount)->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)();
  }
  psVar2 = (string *)*local_a8;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"animated_positions","");
  XML::childOpt((XML *)local_68,psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((_Base_ptr)local_68._0_8_ == (_Base_ptr)0x0) {
    psVar2 = (string *)*local_a8;
    siglen = local_a8;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"positions","");
    XML::childOpt((XML *)&local_88,psVar2);
    loadVec3ffArray((avector<Vec3ff> *)&local_e8,local_a0,
                    (Ref<embree::XML> *)&local_88._M_allocated_capacity);
    std::
    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                *)&pHVar10->positions,
               (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
               &local_e8);
    alignedFree((void *)local_e8.field_2._8_8_);
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    local_e8.field_2._8_8_ = (void *)0x0;
    if ((long *)local_88._M_allocated_capacity != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_allocated_capacity + 0x18))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    pXVar3 = (XML *)*local_a8;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"positions2","");
    bVar7 = XML::hasChild(pXVar3,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (bVar7) {
      psVar2 = (string *)*local_a8;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"positions2","");
      XML::childOpt((XML *)&local_88,psVar2);
      loadVec3ffArray((avector<Vec3ff> *)&local_e8,local_a0,
                      (Ref<embree::XML> *)&local_88._M_allocated_capacity);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)&pHVar10->positions,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e8);
      alignedFree((void *)local_e8.field_2._8_8_);
      local_e8._M_string_length = 0;
      local_e8.field_2._M_allocated_capacity = 0;
      local_e8.field_2._8_8_ = (void *)0x0;
      if ((long *)local_88._M_allocated_capacity != (long *)0x0) {
        (**(code **)(*(long *)local_88._M_allocated_capacity + 0x18))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
    }
  }
  else if (((_Base_ptr)(local_68._0_8_ + 0x80))->_M_parent != *(_Base_ptr *)(local_68._0_8_ + 0x80))
  {
    uVar11 = 0;
    do {
      XML::child((XML *)&local_c8,local_68._0_8_);
      loadVec3ffArray((avector<Vec3ff> *)&local_e8,local_a0,(Ref<embree::XML> *)&local_c8);
      std::
      vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  *)&pHVar10->positions,
                 (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                 &local_e8);
      alignedFree((void *)local_e8.field_2._8_8_);
      local_e8._M_string_length = 0;
      local_e8.field_2._M_allocated_capacity = 0;
      local_e8.field_2._8_8_ = (void *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 0x18))();
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)((_Base_ptr)(local_68._0_8_ + 0x80))->_M_parent -
                              *(long *)(local_68._0_8_ + 0x80) >> 3));
  }
  if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_68._0_8_ + 0x18))();
  }
  psVar2 = (string *)*local_a8;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"indices","");
  XML::childOpt((XML *)&local_c8,psVar2);
  loadVec2iArray((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)local_68,local_a0
                 ,(Ref<embree::XML> *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_c8._M_dataplus._M_p + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize(&pHVar10->hairs,(long)(local_68._8_8_ - local_68._0_8_) >> 3);
  if (local_68._8_8_ != local_68._0_8_) {
    siglen = (undefined8 *)0x0;
    do {
      (pHVar10->hairs).
      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)siglen] =
           *(Hair *)(local_68._0_8_ + (long)siglen * 8);
      siglen = (undefined8 *)((long)siglen + 1);
    } while (siglen < (ulong)((long)(local_68._8_8_ - local_68._0_8_) >> 3));
  }
  pXVar3 = (XML *)*local_a8;
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"tessellation_rate","");
  pHVar10 = local_90;
  XML::parm(&local_e8,pXVar3,&local_c8);
  _Var6._M_p = local_38._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_e8);
  if (iVar8 != 0) {
    uVar9 = atoi(local_e8._M_dataplus._M_p);
    pHVar10->tessellation_rate = uVar9;
  }
  psVar2 = (string *)*local_a8;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"flags","");
  XML::childOpt((XML *)(local_68 + 0x18),psVar2);
  ctx = local_a0;
  loadUCharArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,local_a0,
                 (Ref<embree::XML> *)(local_68 + 0x18));
  puVar4 = (pHVar10->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pHVar10->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_88._M_allocated_capacity;
  (pHVar10->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
  (pHVar10->flags).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_78[0];
  local_88._M_allocated_capacity = 0;
  local_88._8_8_ = 0;
  local_78[0] = (pointer)0x0;
  sig = extraout_RDX;
  if ((puVar4 != (pointer)0x0) &&
     (operator_delete(puVar4), sig = extraout_RDX_00,
     (void *)local_88._M_allocated_capacity != (void *)0x0)) {
    operator_delete((void *)local_88._M_allocated_capacity);
    sig = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_68._24_8_)[3])();
    sig = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
    sig = extraout_RDX_03;
  }
  SceneGraph::HairSetNode::verify(pHVar10,(EVP_PKEY_CTX *)ctx,sig,(size_t)siglen,in_R8,in_R9);
  *(HairSetNode **)_Var6._M_p = pHVar10;
  (*(pHVar10->super_Node).super_RefCount._vptr_RefCount[2])(pHVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((_Base_ptr)local_68._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
  (*(pHVar10->super_Node).super_RefCount._vptr_RefCount[3])(pHVar10);
  if ((long *)local_98._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_98._M_p + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)_Var6._M_p;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBezierCurves(const Ref<XML>& xml, SceneGraph::CurveSubtype subtype)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    RTCGeometryType type = (subtype == SceneGraph::ROUND_CURVE) ? RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE : RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions2")));
    }
    
    std::vector<Vec2i> indices = loadVec2iArray(xml->childOpt("indices"));
    mesh->hairs.resize(indices.size()); 
    for (size_t i=0; i<indices.size(); i++) 
      mesh->hairs[i] = SceneGraph::HairSetNode::Hair(indices[i].x,indices[i].y);

    std::string tessellation_rate = xml->parm("tessellation_rate");
    if (tessellation_rate != "")
      mesh->tessellation_rate = atoi(tessellation_rate.c_str());

    mesh->flags = loadUCharArray(xml->childOpt("flags"));

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }